

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit-interleave.cc
# Opt level: O3

uint32 util_bits::InterleaveUint16(uint16 val0,uint16 val1)

{
  uint uVar1;
  undefined6 in_register_00000032;
  uint uVar2;
  undefined6 in_register_0000003a;
  
  uVar2 = (uint)CONCAT62(in_register_0000003a,val0);
  uVar1 = (uint)CONCAT62(in_register_00000032,val1);
  return (uint)*(ushort *)(&kInterleaveLut + (ulong)(uVar1 >> 8) * 2) << 0x11 |
         (uint)*(ushort *)(&kInterleaveLut + (ulong)(uVar1 & 0xff) * 2) * 2 |
         CONCAT22(*(undefined2 *)(&kInterleaveLut + (ulong)(uVar2 >> 8) * 2),
                  *(undefined2 *)(&kInterleaveLut + (ulong)(uVar2 & 0xff) * 2));
}

Assistant:

uint32 InterleaveUint16(const uint16 val0, const uint16 val1) {
  return kInterleaveLut[val0 & 0xff] |
      (kInterleaveLut[val0 >> 8] << 16) |
      (kInterleaveLut[val1 & 0xff] << 1) |
      (kInterleaveLut[val1 >> 8] << 17);
}